

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

Expression * __thiscall rsg::SwizzleOp::createNextChild(SwizzleOp *this,GeneratorState *state)

{
  pointer *this_00;
  ValueRangeAccess dst;
  ConstValueRangeAccess valueRange;
  ValueRangeAccess valueRange_00;
  Type baseType;
  VariableType *pVVar1;
  Expression *pEVar2;
  Scalar *in_stack_fffffffffffffde0;
  ValueRangeAccess local_1f0;
  VariableType *local_1d8;
  Scalar *pSStack_1d0;
  Scalar *local_1c8;
  ValueRangeAccess local_1b8;
  ConstValueRangeAccess local_1a0;
  ValueRangeAccess local_188;
  ConstValueRangeAccess local_170;
  ValueRangeAccess local_158;
  ValueRangeAccess local_140;
  uint local_124;
  int local_120;
  int inElemNdx;
  int outElemNdx;
  int numOutputElements;
  Scalar *pSStack_110;
  Scalar *local_108;
  undefined1 local_f0 [8];
  ValueRange inValueRange;
  VariableType inVarType;
  GeneratorState *state_local;
  SwizzleOp *this_local;
  
  if (this->m_child == (Expression *)0x0) {
    pVVar1 = ValueRange::getType(&this->m_outValueRange);
    baseType = VariableType::getBaseType(pVVar1);
    this_00 = &inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    VariableType::VariableType((VariableType *)this_00,baseType,this->m_numInputElements);
    ValueRange::ValueRange((ValueRange *)local_f0,(VariableType *)this_00);
    ValueRange::operator_cast_to_ValueRangeAccess
              ((ValueRangeAccess *)&outElemNdx,(ValueRange *)local_f0);
    valueRange_00.super_ConstValueRangeAccess.m_min = local_108;
    valueRange_00.super_ConstValueRangeAccess.m_type = (VariableType *)pSStack_110;
    valueRange_00.super_ConstValueRangeAccess.m_max = in_stack_fffffffffffffde0;
    anon_unknown_0::setInfiniteRange(valueRange_00);
    pVVar1 = ValueRange::getType(&this->m_outValueRange);
    inElemNdx = VariableType::getNumElements(pVVar1);
    for (local_120 = 0; local_120 < inElemNdx; local_120 = local_120 + 1) {
      local_124 = (uint)this->m_swizzle[local_120];
      ValueRange::asAccess(&local_158,(ValueRange *)local_f0);
      ValueRangeAccess::component(&local_140,&local_158,local_124);
      ValueRange::asAccess(&local_188,(ValueRange *)local_f0);
      ValueRangeAccess::component((ValueRangeAccess *)&local_170,&local_188,local_124);
      ValueRange::asAccess(&local_1b8,&this->m_outValueRange);
      ValueRangeAccess::component((ValueRangeAccess *)&local_1a0,&local_1b8,local_120);
      dst.super_ConstValueRangeAccess.m_min = local_140.super_ConstValueRangeAccess.m_min;
      dst.super_ConstValueRangeAccess.m_type = local_140.super_ConstValueRangeAccess.m_type;
      dst.super_ConstValueRangeAccess.m_max = local_140.super_ConstValueRangeAccess.m_max;
      ValueRange::computeIntersection(dst,&local_170,&local_1a0);
    }
    GeneratorState::pushPrecedence(state,2);
    ValueRange::asAccess(&local_1f0,(ValueRange *)local_f0);
    local_1c8 = local_1f0.super_ConstValueRangeAccess.m_max;
    local_1d8 = local_1f0.super_ConstValueRangeAccess.m_type;
    pSStack_1d0 = local_1f0.super_ConstValueRangeAccess.m_min;
    valueRange.m_min = local_1f0.super_ConstValueRangeAccess.m_min;
    valueRange.m_type = local_1f0.super_ConstValueRangeAccess.m_type;
    valueRange.m_max = local_1f0.super_ConstValueRangeAccess.m_max;
    pEVar2 = Expression::createRandom(state,valueRange);
    this->m_child = pEVar2;
    GeneratorState::popPrecedence(state);
    this_local = (SwizzleOp *)this->m_child;
    ValueRange::~ValueRange((ValueRange *)local_f0);
    VariableType::~VariableType
              ((VariableType *)
               &inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_local = (SwizzleOp *)0x0;
  }
  return &this_local->super_Expression;
}

Assistant:

Expression* SwizzleOp::createNextChild (GeneratorState& state)
{
	if (m_child)
		return DE_NULL;

	// Compute input value range.
	VariableType	inVarType		= VariableType(m_outValueRange.getType().getBaseType(), m_numInputElements);
	ValueRange		inValueRange	= ValueRange(inVarType);

	// Initialize all inputs to -inf..inf
	setInfiniteRange(inValueRange);

	// Compute intersections.
	int numOutputElements = m_outValueRange.getType().getNumElements();
	for (int outElemNdx = 0; outElemNdx < numOutputElements; outElemNdx++)
	{
		int inElemNdx = m_swizzle[outElemNdx];
		ValueRange::computeIntersection(inValueRange.asAccess().component(inElemNdx), inValueRange.asAccess().component(inElemNdx), m_outValueRange.asAccess().component(outElemNdx));
	}

	// Create child.
	state.pushPrecedence(swizzlePrecedence);
	m_child = Expression::createRandom(state, inValueRange.asAccess());
	state.popPrecedence();

	return m_child;
}